

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Clip_x86_avx512::forward_inplace(Clip_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [64];
  int iVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  float fVar12;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  
  iVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar6 = 0;
  uVar5 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pauVar7 = (undefined1 (*) [64])
              (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
              (long)bottom_top_blob->data);
    auVar9 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_Clip).min));
    auVar10 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_Clip).max));
    for (iVar8 = 0; iVar8 + 0xf < iVar4; iVar8 = iVar8 + 0x10) {
      auVar11 = vmaxps_avx512f(auVar9,*pauVar7);
      auVar11 = vminps_avx512f(auVar11,auVar10);
      *pauVar7 = auVar11;
      pauVar7 = pauVar7 + 1;
    }
    fVar1 = (this->super_Clip).min;
    auVar14._4_4_ = fVar1;
    auVar14._0_4_ = fVar1;
    auVar14._8_4_ = fVar1;
    auVar14._12_4_ = fVar1;
    auVar14._16_4_ = fVar1;
    auVar14._20_4_ = fVar1;
    auVar14._24_4_ = fVar1;
    auVar14._28_4_ = fVar1;
    fVar1 = (this->super_Clip).max;
    auVar16._4_4_ = fVar1;
    auVar16._0_4_ = fVar1;
    auVar16._8_4_ = fVar1;
    auVar16._12_4_ = fVar1;
    auVar16._16_4_ = fVar1;
    auVar16._20_4_ = fVar1;
    auVar16._24_4_ = fVar1;
    auVar16._28_4_ = fVar1;
    for (; iVar8 + 7 < iVar4; iVar8 = iVar8 + 8) {
      auVar3 = vmaxps_avx(auVar14,*(undefined1 (*) [32])*pauVar7);
      auVar3 = vminps_avx(auVar3,auVar16);
      *(undefined1 (*) [32])*pauVar7 = auVar3;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
    }
    fVar1 = (this->super_Clip).min;
    auVar13._4_4_ = fVar1;
    auVar13._0_4_ = fVar1;
    auVar13._8_4_ = fVar1;
    auVar13._12_4_ = fVar1;
    fVar1 = (this->super_Clip).max;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    for (; iVar8 + 3 < iVar4; iVar8 = iVar8 + 4) {
      auVar2 = vmaxps_avx(auVar13,*(undefined1 (*) [16])*pauVar7);
      auVar2 = vminps_avx(auVar2,auVar15);
      *(undefined1 (*) [16])*pauVar7 = auVar2;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
    }
    for (; iVar8 < iVar4; iVar8 = iVar8 + 1) {
      fVar1 = (this->super_Clip).min;
      fVar12 = *(float *)*pauVar7;
      if (*(float *)*pauVar7 < fVar1) {
        *(float *)*pauVar7 = fVar1;
        fVar12 = fVar1;
      }
      fVar1 = (this->super_Clip).max;
      if (fVar1 < fVar12) {
        *(float *)*pauVar7 = fVar1;
      }
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 4);
    }
  }
  return 0;
}

Assistant:

int Clip_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}